

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void DisableCursor(void)

{
  glfwSetInputMode(CORE.Window.handle,0x33001,0x34003);
  CORE.Input.Mouse.cursorHidden = true;
  return;
}

Assistant:

void DisableCursor(void)
{
#if defined(PLATFORM_DESKTOP)
    glfwSetInputMode(CORE.Window.handle, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
#endif
#if defined(PLATFORM_WEB)
    emscripten_request_pointerlock("#canvas", 1);
#endif
#if defined(PLATFORM_UWP)
    UWPGetMouseLockFunc()();
#endif
    CORE.Input.Mouse.cursorHidden = true;
}